

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O1

void __thiscall
TTD::SnapshotExtractor::ExtractTypeIfNeeded
          (SnapshotExtractor *this,Type *jstype,ThreadContext *threadContext)

{
  unsigned_long id;
  bool bVar1;
  int32 iVar2;
  Entry *pEVar3;
  SnapType *sType_00;
  SlabAllocator *alloc;
  SnapHandler *optHandler;
  SnapType *local_38;
  SnapType *sType;
  
  iVar2 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)jstype);
  if ((this->m_marks).m_markArray[iVar2] != Clear) {
    bVar1 = Js::DynamicType::Is(jstype->typeId);
    if (bVar1) {
      ExtractHandlerIfNeeded(this,*(DynamicTypeHandler **)(jstype + 1),threadContext);
      id._0_4_ = jstype[1].typeId;
      id._4_1_ = jstype[1].flags;
      id._5_3_ = *(undefined3 *)&jstype[1].field_0x5;
      pEVar3 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::
               FindSlotForId<false>(&this->m_idToHandlerMap,id);
      optHandler = pEVar3->Data;
    }
    else {
      optHandler = (SnapHandler *)0x0;
    }
    sType_00 = SnapShot::GetNextAvailableTypeEntry(this->m_pendingSnap);
    local_38 = sType_00;
    alloc = SnapShot::GetSnapshotSlabAllocator(this->m_pendingSnap);
    Js::Type::ExtractSnapType(jstype,sType_00,optHandler,alloc);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::AddItem
              (&this->m_idToTypeMap,local_38->TypePtrId,&local_38);
    iVar2 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)jstype);
    (this->m_marks).m_markArray[iVar2] = Clear;
  }
  return;
}

Assistant:

void SnapshotExtractor::ExtractTypeIfNeeded(Js::Type* jstype, ThreadContext* threadContext)
    {
        if(this->m_marks.IsMarked(jstype))
        {
            NSSnapType::SnapHandler* sHandler = nullptr;

            if(Js::DynamicType::Is(jstype))
            {
                this->ExtractHandlerIfNeeded(static_cast<Js::DynamicType*>(jstype)->GetTypeHandler(), threadContext);

                Js::DynamicTypeHandler* dhandler = static_cast<const Js::DynamicType*>(jstype)->GetTypeHandler();

                TTD_PTR_ID handlerId = TTD_CONVERT_TYPEINFO_TO_PTR_ID(dhandler);
                sHandler = this->m_idToHandlerMap.LookupKnownItem(handlerId);
            }

            NSSnapType::SnapType* sType = this->m_pendingSnap->GetNextAvailableTypeEntry();
            jstype->ExtractSnapType(sType, sHandler, this->m_pendingSnap->GetSnapshotSlabAllocator());

            this->m_idToTypeMap.AddItem(sType->TypePtrId, sType);
            this->m_marks.ClearMark(jstype);
        }
    }